

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sourcesdialog.cpp
# Opt level: O3

void __thiscall FSSSourcesDialog::add_source(FSSSourcesDialog *this,PSource *source)

{
  QFormLayout *pQVar1;
  uint uVar2;
  DataSourceType DVar3;
  QHBoxLayout *this_00;
  storage_type *psVar4;
  QPixmap *pQVar5;
  QPathEdit *this_01;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  undefined8 local_b8;
  char16_t *pcStack_b0;
  qsizetype local_a8;
  QArrayData *local_98;
  char16_t *pcStack_90;
  qsizetype local_88;
  undefined4 local_78;
  undefined4 uStack_74;
  long local_68 [2];
  PSource local_58;
  QString local_48;
  
  this_00 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(this_00);
  pQVar1 = this->layout;
  (**((source->super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_Source)
            (&local_78);
  if ((char *)CONCAT44(uStack_74,local_78) == (char *)0x0) {
    psVar4 = (storage_type *)0x0;
  }
  else {
    psVar4 = (storage_type *)strlen((char *)CONCAT44(uStack_74,local_78));
  }
  QVar6.m_data = psVar4;
  QVar6.m_size = (qsizetype)&local_98;
  QString::fromUtf8(QVar6);
  local_b8 = local_98;
  pcStack_b0 = pcStack_90;
  local_a8 = local_88;
  QFormLayout::addRow((QString *)pQVar1,(QLayout *)&local_b8);
  if (local_b8 != (QArrayData *)0x0) {
    LOCK();
    (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_b8,2,8);
    }
  }
  if ((long *)CONCAT44(uStack_74,local_78) != local_68) {
    operator_delete((long *)CONCAT44(uStack_74,local_78),local_68[0] + 1);
  }
  pQVar5 = (QPixmap *)operator_new(0x28);
  QLabel::QLabel((QLabel *)pQVar5,this,0);
  uVar2 = (*((source->super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            _vptr_Source[2])();
  QVar7.m_data = (storage_type *)((ulong)(uVar2 & 0xff) * 4 + 0x24);
  QVar7.m_size = (qsizetype)&local_78;
  QString::fromUtf8(QVar7);
  local_b8 = (QArrayData *)CONCAT44(uStack_74,local_78);
  local_a8 = local_68[0];
  QPixmap::QPixmap((QPixmap *)&local_98,&local_b8,0,0);
  QLabel::setPixmap(pQVar5);
  QPixmap::~QPixmap((QPixmap *)&local_98);
  if (local_b8 != (QArrayData *)0x0) {
    LOCK();
    (local_b8->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_b8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_b8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_b8,2,8);
    }
  }
  QBoxLayout::addWidget(this_00,pQVar5,0,0);
  this_01 = (QPathEdit *)operator_new(0xb0);
  QPathEdit::QPathEdit(this_01,(QWidget *)this,SeperatedButton);
  local_58.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (source->super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_58.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (source->super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_58.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_58.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_58.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_58.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_58.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  DVar3 = FSSDataModel::getType(&local_58);
  if (local_58.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  QPathEdit::setPathMode(this_01,(uint)(DVar3 != DataSourceTypeDos));
  (*((source->super___shared_ptr<Data::Source,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->_vptr_Source[1]
  )(&local_78);
  if ((char *)CONCAT44(uStack_74,local_78) == (char *)0x0) {
    psVar4 = (storage_type *)0x0;
  }
  else {
    psVar4 = (storage_type *)strlen((char *)CONCAT44(uStack_74,local_78));
  }
  QVar8.m_data = psVar4;
  QVar8.m_size = (qsizetype)&local_98;
  QString::fromUtf8(QVar8);
  local_48.d.d = (Data *)local_98;
  local_48.d.ptr = pcStack_90;
  local_48.d.size = local_88;
  QPathEdit::setPath(this_01,&local_48,false);
  if (&(local_48.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d.d)->super_QArrayData,2,8);
    }
  }
  if ((long *)CONCAT44(uStack_74,local_78) != local_68) {
    operator_delete((long *)CONCAT44(uStack_74,local_78),local_68[0] + 1);
  }
  QBoxLayout::addWidget(this_00,this_01,0,0);
  return;
}

Assistant:

void
FSSSourcesDialog::add_source(Data::PSource source) {
  QHBoxLayout *line_layout = new QHBoxLayout();
  layout->addRow(source->get_name().c_str(), line_layout);

  QLabel *label = new QLabel(this);
  label->setPixmap(QPixmap(source->is_loaded() ?
                           ":/icons/Actions-dialog-ok-apply-icon.png" :
                           ":/icons/Actions-edit-delete-icon.png"));
  line_layout->addWidget(label);

  QPathEdit *path_edit = new QPathEdit(this);
  FSSDataModel::DataSourceType type = FSSDataModel::getType(source);
  path_edit->setPathMode((type == FSSDataModel::DataSourceTypeDos) ?
                         QPathEdit::ExistingFile :
                         QPathEdit::ExistingFolder);
  path_edit->setPath(source->get_path().c_str());
  line_layout->addWidget(path_edit);
}